

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O3

void __thiscall TC_parser<false>::nameSpaceInfo(TC_parser<false> *this)

{
  byte *pos;
  uint64_t uVar1;
  byte bVar2;
  byte *pbVar3;
  substring sVar4;
  
  pos = (byte *)this->reading_head;
  if (pos != (byte *)this->endLine) {
    bVar2 = *pos;
    if (((0x3a < bVar2) || ((0x400000100002200U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) &&
       (bVar2 != 0x7c)) {
      this->index = bVar2;
      if (this->redefine_some == true) {
        bVar2 = (*this->redefine)[bVar2];
        this->index = bVar2;
      }
      pbVar3 = pos;
      if ((this->ae->super_example_predict).feature_space[bVar2].values._end ==
          (this->ae->super_example_predict).feature_space[bVar2].values._begin) {
        this->new_index = true;
      }
      while( true ) {
        bVar2 = *pbVar3;
        if ((((ulong)bVar2 < 0x3b) && ((0x400000100000200U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
           ((bVar2 == 0x7c || ((pbVar3 == (byte *)this->endLine || (bVar2 == 0xd)))))) break;
        this->reading_head = (char *)(pbVar3 + 1);
        pbVar3 = pbVar3 + 1;
      }
      sVar4.end = (char *)pbVar3;
      sVar4.begin = (char *)pos;
      uVar1 = (*this->p->hasher)(sVar4,(ulong)this->hash_seed);
      this->channel_hash = uVar1;
      nameSpaceInfoValue(this);
      return;
    }
  }
  parserWarning(this,"malformed example! String expected after : \"",this->beginLine,(char *)pos,
                "\"");
  return;
}

Assistant:

inline void nameSpaceInfo()
  {
    if (reading_head == endLine || *reading_head == '|' || *reading_head == ' ' || *reading_head == '\t' ||
        *reading_head == ':' || *reading_head == '\r')
    {
      // syntax error
      parserWarning("malformed example! String expected after : \"", beginLine, reading_head, "\"");
    }
    else
    {
      // NameSpaceInfo --> 'String' NameSpaceInfoValue
      index = (unsigned char)(*reading_head);
      if (redefine_some)
        index = (*redefine)[index];  // redefine index
      if (ae->feature_space[index].size() == 0)
        new_index = true;
      substring name = read_name();
      if (audit)
      {
        v_array<char> base_v_array = v_init<char>();
        push_many(base_v_array, name.begin, name.end - name.begin);
        base_v_array.push_back('\0');
        if (base != nullptr)
          free(base);
        base = base_v_array.begin();
      }
      channel_hash = p->hasher(name, this->hash_seed);
      nameSpaceInfoValue();
    }
  }